

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_non_empty_file(char *filename,wchar_t line,char *f1)

{
  int iVar1;
  undefined1 local_b8 [8];
  stat st;
  char *f1_local;
  wchar_t line_local;
  char *filename_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)f1;
  assertion_count(filename,line);
  iVar1 = stat((char *)st.__glibc_reserved[2],(stat *)local_b8);
  if (iVar1 == 0) {
    if (st.st_rdev == 0) {
      failure_start(filename,line,"File empty: %s",st.__glibc_reserved[2]);
      failure_finish((void *)0x0);
      filename_local._4_4_ = L'\0';
    }
    else {
      filename_local._4_4_ = L'\x01';
    }
  }
  else {
    failure_start(filename,line,"Stat failed: %s",st.__glibc_reserved[2]);
    failure_finish((void *)0x0);
    filename_local._4_4_ = L'\0';
  }
  return filename_local._4_4_;
}

Assistant:

int
assertion_non_empty_file(const char *filename, int line, const char *f1)
{
	struct stat st;

	assertion_count(filename, line);

	if (stat(f1, &st) != 0) {
		failure_start(filename, line, "Stat failed: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	if (st.st_size == 0) {
		failure_start(filename, line, "File empty: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}